

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O0

int mbedtls_internal_aes_decrypt(mbedtls_aes_context *ctx,uchar *input,uchar *output)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint *puVar15;
  uint *puVar16;
  uint local_50;
  uint local_4c;
  uint32_t Y3;
  uint32_t Y2;
  uint32_t Y1;
  uint32_t Y0;
  uint32_t X3;
  uint32_t X2;
  uint32_t X1;
  uint32_t X0;
  uint32_t *RK;
  uchar *puStack_20;
  int i;
  uchar *output_local;
  uchar *input_local;
  mbedtls_aes_context *ctx_local;
  
  puVar15 = ctx->rk;
  X2 = *puVar15 ^ *(uint *)input;
  X3 = puVar15[1] ^ *(uint *)(input + 4);
  Y0 = puVar15[2] ^ *(uint *)(input + 8);
  _X1 = puVar15 + 4;
  Y1 = puVar15[3] ^ *(uint *)(input + 0xc);
  RK._4_4_ = ctx->nr >> 1;
  while (RK._4_4_ = RK._4_4_ + -1, 0 < RK._4_4_) {
    uVar4 = *_X1 ^ RT0[X2 & 0xff] ^ RT1[Y1 >> 8 & 0xff] ^ RT2[Y0 >> 0x10 & 0xff] ^ RT3[X3 >> 0x18];
    uVar5 = _X1[1] ^ RT0[X3 & 0xff] ^ RT1[X2 >> 8 & 0xff] ^ RT2[Y1 >> 0x10 & 0xff] ^ RT3[Y0 >> 0x18]
    ;
    uVar6 = _X1[2] ^ RT0[Y0 & 0xff] ^ RT1[X3 >> 8 & 0xff] ^ RT2[X2 >> 0x10 & 0xff] ^ RT3[Y1 >> 0x18]
    ;
    uVar7 = _X1[3] ^ RT0[Y1 & 0xff] ^ RT1[Y0 >> 8 & 0xff] ^ RT2[X3 >> 0x10 & 0xff] ^ RT3[X2 >> 0x18]
    ;
    X2 = _X1[4] ^ RT0[uVar4 & 0xff] ^ RT1[uVar7 >> 8 & 0xff] ^ RT2[uVar6 >> 0x10 & 0xff] ^
         RT3[uVar5 >> 0x18];
    X3 = _X1[5] ^ RT0[uVar5 & 0xff] ^ RT1[uVar4 >> 8 & 0xff] ^ RT2[uVar7 >> 0x10 & 0xff] ^
         RT3[uVar6 >> 0x18];
    puVar15 = _X1 + 7;
    Y0 = _X1[6] ^ RT0[uVar6 & 0xff] ^ RT1[uVar5 >> 8 & 0xff] ^ RT2[uVar4 >> 0x10 & 0xff] ^
         RT3[uVar7 >> 0x18];
    _X1 = _X1 + 8;
    Y1 = *puVar15 ^ RT0[uVar7 & 0xff] ^ RT1[uVar6 >> 8 & 0xff] ^ RT2[uVar5 >> 0x10 & 0xff] ^
         RT3[uVar4 >> 0x18];
  }
  Y2 = *_X1 ^ RT0[X2 & 0xff] ^ RT1[Y1 >> 8 & 0xff] ^ RT2[Y0 >> 0x10 & 0xff] ^ RT3[X3 >> 0x18];
  Y3 = _X1[1] ^ RT0[X3 & 0xff] ^ RT1[X2 >> 8 & 0xff] ^ RT2[Y1 >> 0x10 & 0xff] ^ RT3[Y0 >> 0x18];
  local_4c = _X1[2] ^ RT0[Y0 & 0xff] ^ RT1[X3 >> 8 & 0xff] ^ RT2[X2 >> 0x10 & 0xff] ^
             RT3[Y1 >> 0x18];
  puVar15 = _X1 + 4;
  local_50 = _X1[3] ^ RT0[Y1 & 0xff] ^ RT1[Y0 >> 8 & 0xff] ^ RT2[X3 >> 0x10 & 0xff] ^
             RT3[X2 >> 0x18];
  uVar7 = *puVar15 ^ (uint)RSb[Y2 & 0xff] ^ (uint)RSb[local_50 >> 8 & 0xff] << 8;
  uVar8 = uVar7 ^ (uint)RSb[local_4c >> 0x10 & 0xff] << 0x10;
  X2 = uVar8 ^ (uint)RSb[Y3 >> 0x18] << 0x18;
  uVar4 = _X1[5];
  bVar1 = RSb[Y3 & 0xff];
  uVar9 = uVar4 ^ bVar1 ^ (uint)RSb[Y2 >> 8 & 0xff] << 8;
  uVar10 = uVar9 ^ (uint)RSb[local_50 >> 0x10 & 0xff] << 0x10;
  X3 = uVar10 ^ (uint)RSb[local_4c >> 0x18] << 0x18;
  puVar16 = _X1 + 7;
  uVar5 = _X1[6];
  bVar2 = RSb[local_4c & 0xff];
  uVar11 = uVar5 ^ bVar2 ^ (uint)RSb[Y3 >> 8 & 0xff] << 8;
  uVar12 = uVar11 ^ (uint)RSb[Y2 >> 0x10 & 0xff] << 0x10;
  Y0 = uVar12 ^ (uint)RSb[local_50 >> 0x18] << 0x18;
  _X1 = _X1 + 8;
  uVar6 = *puVar16;
  bVar3 = RSb[local_50 & 0xff];
  uVar13 = uVar6 ^ bVar3 ^ (uint)RSb[local_4c >> 8 & 0xff] << 8;
  uVar14 = uVar13 ^ (uint)RSb[Y3 >> 0x10 & 0xff] << 0x10;
  Y1 = uVar14 ^ (uint)RSb[Y2 >> 0x18] << 0x18;
  *output = (uchar)(*puVar15 ^ (uint)RSb[Y2 & 0xff]);
  output[1] = (uchar)(uVar7 >> 8);
  output[2] = (uchar)(uVar8 >> 0x10);
  output[3] = (uchar)(X2 >> 0x18);
  output[4] = (uchar)(uVar4 ^ bVar1);
  output[5] = (uchar)(uVar9 >> 8);
  output[6] = (uchar)(uVar10 >> 0x10);
  output[7] = (uchar)(X3 >> 0x18);
  output[8] = (uchar)(uVar5 ^ bVar2);
  output[9] = (uchar)(uVar11 >> 8);
  output[10] = (uchar)(uVar12 >> 0x10);
  output[0xb] = (uchar)(Y0 >> 0x18);
  output[0xc] = (uchar)(uVar6 ^ bVar3);
  output[0xd] = (uchar)(uVar13 >> 8);
  output[0xe] = (uchar)(uVar14 >> 0x10);
  output[0xf] = (uchar)(Y1 >> 0x18);
  puStack_20 = output;
  output_local = input;
  input_local = (uchar *)ctx;
  mbedtls_platform_zeroize(&X2,4);
  mbedtls_platform_zeroize(&X3,4);
  mbedtls_platform_zeroize(&Y0,4);
  mbedtls_platform_zeroize(&Y1,4);
  mbedtls_platform_zeroize(&Y2,4);
  mbedtls_platform_zeroize(&Y3,4);
  mbedtls_platform_zeroize(&local_4c,4);
  mbedtls_platform_zeroize(&local_50,4);
  mbedtls_platform_zeroize(&X1,8);
  return 0;
}

Assistant:

int mbedtls_internal_aes_decrypt( mbedtls_aes_context *ctx,
                                  const unsigned char input[16],
                                  unsigned char output[16] )
{
    int i;
    uint32_t *RK, X0, X1, X2, X3, Y0, Y1, Y2, Y3;

    RK = ctx->rk;

    GET_UINT32_LE( X0, input,  0 ); X0 ^= *RK++;
    GET_UINT32_LE( X1, input,  4 ); X1 ^= *RK++;
    GET_UINT32_LE( X2, input,  8 ); X2 ^= *RK++;
    GET_UINT32_LE( X3, input, 12 ); X3 ^= *RK++;

    for( i = ( ctx->nr >> 1 ) - 1; i > 0; i-- )
    {
        AES_RROUND( Y0, Y1, Y2, Y3, X0, X1, X2, X3 );
        AES_RROUND( X0, X1, X2, X3, Y0, Y1, Y2, Y3 );
    }

    AES_RROUND( Y0, Y1, Y2, Y3, X0, X1, X2, X3 );

    X0 = *RK++ ^ \
            ( (uint32_t) RSb[ ( Y0       ) & 0xFF ]       ) ^
            ( (uint32_t) RSb[ ( Y3 >>  8 ) & 0xFF ] <<  8 ) ^
            ( (uint32_t) RSb[ ( Y2 >> 16 ) & 0xFF ] << 16 ) ^
            ( (uint32_t) RSb[ ( Y1 >> 24 ) & 0xFF ] << 24 );

    X1 = *RK++ ^ \
            ( (uint32_t) RSb[ ( Y1       ) & 0xFF ]       ) ^
            ( (uint32_t) RSb[ ( Y0 >>  8 ) & 0xFF ] <<  8 ) ^
            ( (uint32_t) RSb[ ( Y3 >> 16 ) & 0xFF ] << 16 ) ^
            ( (uint32_t) RSb[ ( Y2 >> 24 ) & 0xFF ] << 24 );

    X2 = *RK++ ^ \
            ( (uint32_t) RSb[ ( Y2       ) & 0xFF ]       ) ^
            ( (uint32_t) RSb[ ( Y1 >>  8 ) & 0xFF ] <<  8 ) ^
            ( (uint32_t) RSb[ ( Y0 >> 16 ) & 0xFF ] << 16 ) ^
            ( (uint32_t) RSb[ ( Y3 >> 24 ) & 0xFF ] << 24 );

    X3 = *RK++ ^ \
            ( (uint32_t) RSb[ ( Y3       ) & 0xFF ]       ) ^
            ( (uint32_t) RSb[ ( Y2 >>  8 ) & 0xFF ] <<  8 ) ^
            ( (uint32_t) RSb[ ( Y1 >> 16 ) & 0xFF ] << 16 ) ^
            ( (uint32_t) RSb[ ( Y0 >> 24 ) & 0xFF ] << 24 );

    PUT_UINT32_LE( X0, output,  0 );
    PUT_UINT32_LE( X1, output,  4 );
    PUT_UINT32_LE( X2, output,  8 );
    PUT_UINT32_LE( X3, output, 12 );

    mbedtls_platform_zeroize( &X0, sizeof( X0 ) );
    mbedtls_platform_zeroize( &X1, sizeof( X1 ) );
    mbedtls_platform_zeroize( &X2, sizeof( X2 ) );
    mbedtls_platform_zeroize( &X3, sizeof( X3 ) );

    mbedtls_platform_zeroize( &Y0, sizeof( Y0 ) );
    mbedtls_platform_zeroize( &Y1, sizeof( Y1 ) );
    mbedtls_platform_zeroize( &Y2, sizeof( Y2 ) );
    mbedtls_platform_zeroize( &Y3, sizeof( Y3 ) );

    mbedtls_platform_zeroize( &RK, sizeof( RK ) );

    return( 0 );
}